

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_do_toggle(nk_flags *state,nk_command_buffer *out,nk_rect r,nk_bool *active,char *str,
                    int len,nk_toggle_type type,nk_style_toggle *style,nk_input *in,
                    nk_user_font *font)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined4 uVar3;
  undefined4 in_EAX;
  uint uVar4;
  nk_bool nVar5;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var6;
  uint uVar7;
  nk_image *img;
  nk_style_item *pnVar8;
  nk_style_toggle *pnVar9;
  char *string;
  float fVar10;
  float fVar11;
  float fVar12;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar13;
  float fVar14;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  nk_rect r_00;
  nk_rect r_01;
  nk_rect r_02;
  nk_rect r_03;
  nk_rect r_04;
  nk_rect r_05;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect r_06;
  nk_rect rect_01;
  nk_rect b;
  float local_118;
  float fStack_114;
  nk_text local_100;
  nk_toggle_type local_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  char *local_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  r_01.x = r.x;
  fStack_e4 = r.y;
  auVar20._0_4_ = -(uint)(out == (nk_command_buffer *)0x0);
  auVar20._4_4_ = -(uint)(style == (nk_style_toggle *)0x0);
  auVar20._8_4_ = -(uint)(font == (nk_user_font *)0x0);
  auVar20._12_4_ = -(uint)(active == (nk_bool *)0x0);
  uVar4 = movmskps(in_EAX,auVar20);
  p_Var6 = (_func_void_nk_command_buffer_ptr_nk_handle *)(ulong)uVar4;
  if (uVar4 != 0) goto LAB_0012152b;
  local_d8 = font->height;
  fVar18 = style->border;
  _local_68 = ZEXT416((uint)fVar18);
  fVar18 = fVar18 + fVar18;
  fVar13 = (style->touch_padding).x;
  fVar15 = (style->touch_padding).y;
  local_48 = r_01.x - fVar13;
  fStack_44 = fStack_e4 - fVar15;
  fStack_40 = in_XMM0_Dc - 0.0;
  fStack_3c = in_XMM0_Dd - 0.0;
  local_118 = (style->padding).x;
  fStack_114 = (style->padding).y;
  local_78 = local_118 + local_118;
  fStack_74 = fStack_114 + fStack_114;
  fStack_70 = 0.0;
  fStack_6c = 0.0;
  auVar19._0_4_ = local_78 + local_d8;
  auVar19._4_4_ = fStack_74 + local_d8;
  auVar19._8_4_ = local_d8 + 0.0;
  auVar19._12_4_ = local_d8 + 0.0;
  auVar2._8_4_ = in_XMM1_Dc;
  auVar2._0_8_ = r._8_8_;
  auVar2._12_4_ = in_XMM1_Dd;
  auVar20 = maxps(auVar19,auVar2);
  local_b8 = fVar13 + fVar13 + auVar20._0_4_;
  fStack_a4 = auVar20._4_4_;
  fStack_b4 = fVar15 + fVar15 + fStack_a4;
  fStack_b0 = auVar20._8_4_ + 0.0;
  fStack_ac = auVar20._12_4_ + 0.0;
  fVar13 = (fStack_a4 * 0.5 + fStack_e4) - local_d8 * 0.5;
  local_98 = ZEXT416((uint)local_d8);
  local_e8 = r_01.x + local_d8 + style->spacing;
  local_88._8_4_ = in_XMM0_Dc;
  local_88._0_8_ = r._0_8_;
  local_88._12_4_ = in_XMM0_Dd;
  local_58._4_12_ = auVar20._4_12_;
  local_58._0_4_ = auVar20._0_4_ + r_01.x;
  uVar4 = *active;
  *state = *state & 2 | 4;
  r_00.y = fStack_44;
  r_00.x = local_48;
  r_00.h = fStack_b4;
  r_00.w = local_b8;
  local_ec = type;
  fStack_e0 = in_XMM0_Dc;
  fStack_dc = in_XMM0_Dd;
  fStack_d4 = local_d8;
  fStack_d0 = local_d8;
  fStack_cc = local_d8;
  local_c0 = str;
  local_a8 = fVar13;
  fStack_a0 = fStack_a4;
  fStack_9c = fStack_a4;
  nVar5 = nk_button_behavior(state,r_00,in,NK_BUTTON_DEFAULT);
  if (nVar5 != 0) {
    *state = 0x22;
    uVar4 = (uint)(uVar4 == 0);
  }
  auVar17._4_4_ = fStack_e4;
  auVar17._0_4_ = local_e8;
  auVar17._8_4_ = fStack_e0;
  auVar17._12_4_ = fStack_dc;
  if (local_e8 <= (float)local_58._0_4_) {
    auVar17._0_4_ = local_58._0_4_;
  }
  if ((((*state & 0x10) != 0) &&
      ((((uVar7 = 8, in == (nk_input *)0x0 || (fVar15 = (in->mouse).prev.x, fVar15 < local_48)) ||
        (local_48 + local_b8 <= fVar15)) ||
       ((fVar15 = (in->mouse).prev.y, fVar15 < fStack_44 || (fStack_44 + fStack_b4 <= fVar15))))))
     || ((in != (nk_input *)0x0 &&
         (((fVar15 = (in->mouse).prev.x, local_48 <= fVar15 && (fVar15 < local_48 + local_b8)) &&
          ((fVar15 = (in->mouse).prev.y, fStack_44 <= fVar15 &&
           (uVar7 = 0x40, fVar15 < fStack_44 + fStack_b4)))))))) {
    *state = *state | uVar7;
  }
  fVar16 = auVar17._0_4_ - local_e8;
  *active = uVar4;
  fVar15 = (float)local_68._0_4_;
  fVar10 = local_78 + fVar18;
  fVar12 = fStack_74 + fVar18;
  if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    local_68._4_4_ = local_68._0_4_;
    fStack_60 = (float)local_68._0_4_;
    fStack_5c = (float)local_68._0_4_;
    local_78 = local_78 + fVar18;
    fStack_74 = fStack_74 + fVar18;
    fStack_70 = fStack_70 + fVar18;
    fStack_6c = fStack_6c + fVar18;
    (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
    fVar15 = (float)local_68._4_4_;
    fVar10 = local_78;
    fVar12 = fStack_74;
  }
  fStack_e0 = fStack_e4;
  fVar18 = local_118 + r_01.x + (float)local_68._0_4_;
  fVar15 = fStack_114 + fVar13 + fVar15;
  fVar10 = local_d8 - fVar10;
  fVar12 = fStack_d4 - fVar12;
  fStack_e4 = local_a8;
  fStack_dc = fStack_a4;
  uVar3 = local_98._0_4_;
  uVar4 = *state;
  iVar1 = *active;
  if (local_ec == NK_TOGGLE_CHECK) {
    if ((uVar4 & 0x10) == 0) {
      if ((uVar4 & 0x20) != 0) {
        local_100.text = style->text_active;
        goto LAB_001213fa;
      }
      pnVar8 = &style->cursor_normal;
      local_100.text = style->text_normal;
      pnVar9 = style;
    }
    else {
      local_100.text = style->text_hover;
LAB_001213fa:
      pnVar9 = (nk_style_toggle *)&style->hover;
      pnVar8 = &style->cursor_hover;
    }
    if ((pnVar9->normal).type == NK_STYLE_ITEM_COLOR) {
      rect.h = fStack_d4;
      rect.w = local_d8;
      rect.y = fVar13;
      rect.x = r_01.x;
      nk_fill_rect(out,rect,0.0,style->border_color);
      fVar13 = style->border;
      fVar11 = fVar13 + fVar13;
      fVar14 = fVar11;
      if (fVar11 <= (float)local_98._0_4_) {
        fVar14 = (float)local_98._0_4_;
      }
      rect_00.w = fVar14 - fVar11;
      rect_00.y = local_a8 + fVar13;
      rect_00.x = (float)local_88._0_4_ + fVar13;
      rect_00.h = rect_00.w;
      nk_fill_rect(out,rect_00,0.0,(pnVar9->normal).data.color);
    }
    else {
      r_05.h = fStack_d4;
      r_05.w = local_d8;
      r_05.y = fVar13;
      r_05.x = r_01.x;
      nk_draw_image(out,r_05,&(pnVar9->normal).data.image,(nk_color)0xffffffff);
    }
    string = local_c0;
    if (iVar1 != 0) {
      img = (nk_image *)&pnVar8->data;
      if (pnVar8->type == NK_STYLE_ITEM_IMAGE) goto LAB_001214b0;
      rect_01.y = fVar15;
      rect_01.x = fVar18;
      rect_01.h = fVar12;
      rect_01.w = fVar10;
      nk_fill_rect(out,rect_01,0.0,*(nk_color *)img);
    }
  }
  else {
    if ((uVar4 & 0x10) == 0) {
      if ((uVar4 & 0x20) != 0) {
        local_100.text = style->text_active;
        goto LAB_0012131b;
      }
      pnVar8 = &style->cursor_normal;
      local_100.text = style->text_normal;
      pnVar9 = style;
    }
    else {
      local_100.text = style->text_hover;
LAB_0012131b:
      pnVar9 = (nk_style_toggle *)&style->hover;
      pnVar8 = &style->cursor_hover;
    }
    if ((pnVar9->normal).type == NK_STYLE_ITEM_COLOR) {
      r_02.h = fStack_d4;
      r_02.w = local_d8;
      r_02.y = fVar13;
      r_02.x = r_01.x;
      nk_fill_circle(out,r_02,style->border_color);
      fVar13 = style->border;
      fVar11 = fVar13 + fVar13;
      fVar14 = fVar11;
      if (fVar11 <= (float)local_98._0_4_) {
        fVar14 = (float)local_98._0_4_;
      }
      r_03.w = fVar14 - fVar11;
      r_03.y = local_a8 + fVar13;
      r_03.x = (float)local_88._0_4_ + fVar13;
      r_03.h = r_03.w;
      nk_fill_circle(out,r_03,(pnVar9->normal).data.color);
    }
    else {
      r_01.h = fStack_d4;
      r_01.w = local_d8;
      r_01.y = fVar13;
      nk_draw_image(out,r_01,&(pnVar9->normal).data.image,(nk_color)0xffffffff);
    }
    string = local_c0;
    r_04.y = fVar15;
    r_04.x = fVar18;
    if (iVar1 != 0) {
      img = (nk_image *)&pnVar8->data;
      if (pnVar8->type == NK_STYLE_ITEM_IMAGE) {
LAB_001214b0:
        string = local_c0;
        r_06.h = fVar12;
        r_06.w = fVar10;
        r_06.y = fVar15;
        r_06.x = fVar18;
        nk_draw_image(out,r_06,img,(nk_color)0xffffffff);
      }
      else {
        r_04.h = fVar12;
        r_04.w = fVar10;
        nk_fill_circle(out,r_04,*(nk_color *)img);
      }
    }
  }
  local_100.padding.x = 0.0;
  local_100.padding.y = 0.0;
  local_100.background = style->text_background;
  b.y = fStack_e4;
  b.x = local_e8;
  b.h = (float)uVar3;
  b.w = fVar16;
  nk_widget_text(out,b,string,len,&local_100,0x11,font);
  p_Var6 = style->draw_end;
  if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    p_Var6 = (_func_void_nk_command_buffer_ptr_nk_handle *)
             (*p_Var6)(out,(nk_handle)(style->userdata).ptr);
  }
LAB_0012152b:
  return (nk_bool)p_Var6;
}

Assistant:

NK_LIB nk_bool
nk_do_toggle(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect r,
nk_bool *active, const char *str, int len, enum nk_toggle_type type,
const struct nk_style_toggle *style, const struct nk_input *in,
const struct nk_user_font *font)
{
int was_active;
struct nk_rect bounds;
struct nk_rect select;
struct nk_rect cursor;
struct nk_rect label;

NK_ASSERT(style);
NK_ASSERT(out);
NK_ASSERT(font);
if (!out || !style || !font || !active)
return 0;

r.w = NK_MAX(r.w, font->height + 2 * style->padding.x);
r.h = NK_MAX(r.h, font->height + 2 * style->padding.y);

/* add additional touch padding for touch screen devices */
bounds.x = r.x - style->touch_padding.x;
bounds.y = r.y - style->touch_padding.y;
bounds.w = r.w + 2 * style->touch_padding.x;
bounds.h = r.h + 2 * style->touch_padding.y;

/* calculate the selector space */
select.w = font->height;
select.h = select.w;
select.y = r.y + r.h/2.0f - select.h/2.0f;
select.x = r.x;

/* calculate the bounds of the cursor inside the selector */
cursor.x = select.x + style->padding.x + style->border;
cursor.y = select.y + style->padding.y + style->border;
cursor.w = select.w - (2 * style->padding.x + 2 * style->border);
cursor.h = select.h - (2 * style->padding.y + 2 * style->border);

/* label behind the selector */
label.x = select.x + select.w + style->spacing;
label.y = select.y;
label.w = NK_MAX(r.x + r.w, label.x) - label.x;
label.h = select.w;

/* update selector */
was_active = *active;
*active = nk_toggle_behavior(in, bounds, state, *active);

/* draw selector */
if (style->draw_begin)
style->draw_begin(out, style->userdata);
if (type == NK_TOGGLE_CHECK) {
nk_draw_checkbox(out, *state, style, *active, &label, &select, &cursor, str, len, font);
} else {
nk_draw_option(out, *state, style, *active, &label, &select, &cursor, str, len, font);
}
if (style->draw_end)
style->draw_end(out, style->userdata);
return (was_active != *active);
}